

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::NewArrayExpressionSyntax::setChild
          (NewArrayExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_00494694 + *(int *)(&DAT_00494694 + index * 4)))();
  return;
}

Assistant:

void NewArrayExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: newKeyword = child.node() ? &child.node()->as<NameSyntax>() : nullptr; return;
        case 1: openBracket = child.token(); return;
        case 2: sizeExpr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 3: closeBracket = child.token(); return;
        case 4: initializer = child.node() ? &child.node()->as<ParenthesizedExpressionSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}